

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter.cpp
# Opt level: O2

bool asmjit::_abi_1_10::CodeWriterUtils::encodeOffset64
               (uint64_t *dst,int64_t offset64,OffsetFormat *format)

{
  byte bVar1;
  byte bVar2;
  int line;
  bool bVar3;
  ulong uVar4;
  
  bVar1 = format->_immBitCount;
  if ((bVar1 == 0) || ((uint)format->_valueSize << 3 < (uint)bVar1)) {
LAB_00112ef1:
    bVar3 = false;
  }
  else {
    bVar2 = format->_immDiscardLsb;
    if (format->_type == kUnsignedOffset) {
      if (bVar2 != 0) {
        if (0x20 < bVar2) {
          line = 0x5a;
LAB_00112fc9:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/codewriter.cpp"
                     ,line,"discardLsb <= 32");
        }
        if ((((uint)(-1L << (bVar2 & 0x3f)) & 0xfffffffe ^ 0xffffffff) & (uint)offset64) != 0)
        goto LAB_00112ef1;
        offset64 = (ulong)offset64 >> (bVar2 & 0x3f);
      }
      uVar4 = 0xffffffffffffffff >> (-bVar1 & 0x3f);
      if (uVar4 < (ulong)offset64) goto LAB_00112ef1;
      offset64 = offset64 & uVar4;
    }
    else {
      if (bVar2 != 0) {
        if (0x20 < bVar2) {
          line = 0x67;
          goto LAB_00112fc9;
        }
        if ((((uint)(-1L << (bVar2 & 0x3f)) & 0xfffffffe ^ 0xffffffff) & (uint)offset64) != 0)
        goto LAB_00112ef1;
        offset64 = offset64 >> (bVar2 & 0x3f);
      }
      if (format->_type != kSignedOffset) {
        return false;
      }
      if ((offset64 << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f) != offset64) {
        return false;
      }
      uVar4 = 0xffffffffffffffff >> (-bVar1 & 0x3f);
    }
    *dst = (uVar4 & offset64) << (format->_immBitShift & 0x3f);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool CodeWriterUtils::encodeOffset64(uint64_t* dst, int64_t offset64, const OffsetFormat& format) noexcept {
  uint32_t bitCount = format.immBitCount();
  uint32_t discardLsb = format.immDiscardLsb();

  if (!bitCount || bitCount > format.valueSize() * 8u)
    return false;

  uint64_t value;

  // First handle all unsigned offset types.
  if (format.type() == OffsetType::kUnsignedOffset) {
    if (discardLsb) {
      ASMJIT_ASSERT(discardLsb <= 32);
      if ((offset64 & Support::lsbMask<uint32_t>(discardLsb)) != 0)
        return false;
      offset64 = int64_t(uint64_t(offset64) >> discardLsb);
    }

    value = uint64_t(offset64) & Support::lsbMask<uint64_t>(bitCount);
    if (value != uint64_t(offset64))
      return false;
  }
  else {
    // The rest of OffsetType options are all signed.
    if (discardLsb) {
      ASMJIT_ASSERT(discardLsb <= 32);
      if ((offset64 & Support::lsbMask<uint32_t>(discardLsb)) != 0)
        return false;
      offset64 >>= discardLsb;
    }

    if (!Support::isEncodableOffset64(offset64, bitCount))
      return false;

    value = uint64_t(offset64);
  }

  switch (format.type()) {
    case OffsetType::kSignedOffset:
    case OffsetType::kUnsignedOffset: {
      *dst = (value & Support::lsbMask<uint64_t>(bitCount)) << format.immBitShift();
      return true;
    }

    default:
      return false;
  }
}